

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompose.hpp
# Opt level: O2

void __thiscall
MGARD::Decomposer<float>::decompose_level_1D
          (Decomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  size_t n_nodal;
  float *nodal_buffer;
  undefined7 in_register_00000009;
  size_t n_coeff;
  float *coeff_buffer;
  
  n_nodal = (n >> 1) + 1;
  n_coeff = n - n_nodal;
  nodal_buffer = this->data_buffer;
  coeff_buffer = nodal_buffer + (n >> 1) + 1;
  data_reorder_1D<float>(data_pos,n_nodal,n_coeff,nodal_buffer,coeff_buffer);
  compute_interpolant_difference_1D(this,n_coeff,nodal_buffer,coeff_buffer);
  if ((int)CONCAT71(in_register_00000009,nodal_row) == 0) {
    compute_load_vector_coeff_row<float>
              (this->load_v_buffer,n_nodal,n_coeff,h,nodal_buffer,coeff_buffer);
  }
  else {
    compute_load_vector_nodal_row<float>(this->load_v_buffer,n_nodal,n_coeff,h,coeff_buffer);
  }
  compute_correction<float>(this->correction_buffer,n_nodal,h,this->load_v_buffer);
  add_correction(this,n_nodal,nodal_buffer);
  memcpy(data_pos,this->data_buffer,n << 2);
  return;
}

Assistant:

void decompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		data_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
		compute_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		add_correction(n_nodal, nodal_buffer);
		memcpy(data_pos, data_buffer, n*sizeof(T));
	}